

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O3

void * metacallfv_s(void *func,void **args,size_t size)

{
  int iVar1;
  type_id tVar2;
  type_id tVar3;
  type_id tVar4;
  undefined8 in_RAX;
  signature s;
  type ptVar5;
  value pvVar6;
  function_return v;
  value unaff_R12;
  size_t index;
  
  if (func != (void *)0x0) {
    s = function_signature((function_conflict)func);
    tVar2 = (type_id)((ulong)in_RAX >> 0x20);
    if (size != 0) {
      index = 0;
      do {
        iVar1 = value_validate(args[index]);
        if (iVar1 != 0) {
          log_write_impl_va("metacall",0x477,"metacallfv_s",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                            ,LOG_LEVEL_ERROR,
                            "Invalid argument at position %zu when calling to metacallfv_s",index);
          return (void *)0x0;
        }
        ptVar5 = signature_get_type(s,index);
        if (ptVar5 != (type)0x0) {
          tVar2 = type_index(ptVar5);
          tVar3 = value_type_id(args[index]);
          if ((tVar2 != tVar3) &&
             (pvVar6 = value_type_cast(unaff_R12,(type_id)((ulong)in_RAX >> 0x20)),
             pvVar6 != (value)0x0)) {
            args[index] = pvVar6;
          }
        }
        tVar2 = (type_id)((ulong)in_RAX >> 0x20);
        index = index + 1;
      } while (size != index);
    }
    v = function_call((function_conflict)func,args,size);
    if (v != (function_return)0x0) {
      ptVar5 = signature_get_return(s);
      if (ptVar5 == (type)0x0) {
        return v;
      }
      tVar3 = type_index(ptVar5);
      tVar4 = value_type_id(v);
      if (tVar3 == tVar4) {
        return v;
      }
      pvVar6 = value_type_cast(unaff_R12,tVar2);
      if (pvVar6 == (value)0x0) {
        return v;
      }
      return pvVar6;
    }
  }
  return (void *)0x0;
}

Assistant:

void *metacallfv_s(void *func, void *args[], size_t size)
{
	function f = (function)func;

	if (f != NULL)
	{
		signature s = function_signature(f);

		size_t iterator;

		value ret;

		for (iterator = 0; iterator < size; ++iterator)
		{
			if (value_validate(args[iterator]) != 0)
			{
				// TODO: Implement type error return a value
				log_write("metacall", LOG_LEVEL_ERROR, "Invalid argument at position %" PRIuS " when calling to metacallfv_s", iterator);
				return NULL;
			}

			type t = signature_get_type(s, iterator);

			if (t != NULL)
			{
				type_id id = type_index(t);

				if (id != value_type_id((value)args[iterator]))
				{
					value cast_arg = value_type_cast((value)args[iterator], id);

					if (cast_arg != NULL)
					{
						args[iterator] = cast_arg;
					}
				}
			}
		}

		ret = function_call(f, args, size);

		if (ret != NULL)
		{
			type t = signature_get_return(s);

			if (t != NULL)
			{
				type_id id = type_index(t);

				if (id != value_type_id(ret))
				{
					value cast_ret = value_type_cast(ret, id);

					return (cast_ret == NULL) ? ret : cast_ret;
				}
			}
		}

		return ret;
	}

	return NULL;
}